

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessingValidator.cpp
# Opt level: O2

char * CoreML::MLArrayDataType_Name(MLArrayDataType x)

{
  if (x == MLArrayDataTypeINVALID_ARRAY_DATA_TYPE) {
    return "INVALID";
  }
  if (x != MLArrayDataTypeINT32) {
    if (x == MLArrayDataTypeDOUBLE) {
      return "MLArrayDataTypeDOUBLE";
    }
    return "MLArrayDataTypeFLOAT32";
  }
  return "MLArrayDataTypeINT32";
}

Assistant:

static const char * MLArrayDataType_Name(MLArrayDataType x) {
        switch (x) {
            case MLArrayDataTypeINVALID_ARRAY_DATA_TYPE:
                return "INVALID";
            case MLArrayDataTypeFLOAT32:
                return "MLArrayDataTypeFLOAT32";
            case MLArrayDataTypeDOUBLE:
                return "MLArrayDataTypeDOUBLE";
            case MLArrayDataTypeINT32:
                return "MLArrayDataTypeINT32";
        }
    }